

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_teleport_tree.hpp
# Opt level: O1

WorldTeleportTree * WorldTeleportTree::from_json(Json *json)

{
  pointer pcVar1;
  uchar uVar2;
  unsigned_short uVar3;
  const_reference pvVar4;
  WorldTeleportTree *pWVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uchar ret_1;
  uint16_t byte;
  string node_id;
  string name;
  string byte_string;
  stringstream ss;
  uchar local_29b;
  uint16_t local_29a;
  key_type local_298;
  pointer local_278;
  size_type local_270;
  char local_268;
  undefined7 uStack_267;
  undefined8 uStack_260;
  unsigned_short local_258;
  undefined6 uStack_256;
  long local_250;
  long local_248 [2];
  pointer local_238;
  size_type local_230;
  char local_228;
  undefined7 uStack_227;
  undefined8 uStack_220;
  key_type local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  pcVar1 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"name","");
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)local_1b8);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_1f8,pvVar4);
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"treeMapId","");
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)local_1b8);
  local_258 = 0;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
            (pvVar4,&local_258);
  uVar3 = local_258;
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"nodeId","");
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)local_1b8);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_258,pvVar4);
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  local_29a = 0;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"flag","");
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)local_1b8);
  paVar6 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"byte","");
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pvVar4,&local_298);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_1d8,pvVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar6) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) & 0xffffffb5
       | 8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_298,&local_1d8,2,0xffffffffffffffff);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),local_298._M_dataplus._M_p,local_298._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar6) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::istream::_M_extract<unsigned_short>((ushort *)local_1b8);
  local_298._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"flag","");
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_298);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"bit","");
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pvVar4,&local_218);
  local_29b = '\0';
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar4,&local_29b);
  uVar2 = local_29b;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar6) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  pWVar5 = (WorldTeleportTree *)operator_new(0x58);
  local_278 = &local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,local_1f8,local_1f0 + (long)local_1f8);
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,CONCAT62(uStack_256,local_258),
             local_250 + CONCAT62(uStack_256,local_258));
  paVar6 = &(pWVar5->_name).field_2;
  (pWVar5->_name)._M_dataplus._M_p = (pointer)paVar6;
  if (local_278 == &local_268) {
    paVar6->_M_allocated_capacity = CONCAT71(uStack_267,local_268);
    *(undefined8 *)((long)&(pWVar5->_name).field_2 + 8) = uStack_260;
  }
  else {
    (pWVar5->_name)._M_dataplus._M_p = local_278;
    (pWVar5->_name).field_2._M_allocated_capacity = CONCAT71(uStack_267,local_268);
  }
  (pWVar5->_name)._M_string_length = local_270;
  pWVar5->_map_id = uVar3;
  pWVar5->_paired_map_id = 0xffff;
  paVar6 = &(pWVar5->_node_id).field_2;
  (pWVar5->_node_id)._M_dataplus._M_p = (pointer)paVar6;
  if (local_238 == &local_228) {
    paVar6->_M_allocated_capacity = CONCAT71(uStack_227,local_228);
    *(undefined8 *)((long)&(pWVar5->_node_id).field_2 + 8) = uStack_220;
  }
  else {
    (pWVar5->_node_id)._M_dataplus._M_p = local_238;
    (pWVar5->_node_id).field_2._M_allocated_capacity = CONCAT71(uStack_227,local_228);
  }
  (pWVar5->_node_id)._M_string_length = local_230;
  (pWVar5->_flag)._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  (pWVar5->_flag).byte = local_29a;
  (pWVar5->_flag).bit = uVar2;
  local_228 = '\0';
  local_230 = 0;
  local_268 = '\0';
  local_270 = 0;
  local_278 = &local_268;
  local_238 = &local_228;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT62(uStack_256,local_258) != local_248) {
    operator_delete((long *)CONCAT62(uStack_256,local_258),local_248[0] + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  return pWVar5;
}

Assistant:

static WorldTeleportTree* from_json(const Json& json)
    {
        std::string name = json.at("name");
        uint16_t tree_map_id = json.at("treeMapId");
        std::string node_id = json.at("nodeId");

        uint16_t byte = 0;
        std::string byte_string = json.at("flag").at("byte");
        std::stringstream ss;
        ss << std::hex << byte_string.substr(2);
        ss >> byte;
        uint8_t bit = json.at("flag").at("bit");

        return new WorldTeleportTree(name, tree_map_id, node_id, Flag(byte, bit));
    }